

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O2

bool parseICrashStrategy(string *strategy,ICrashStrategy *icrash_strategy)

{
  bool bVar1;
  int iVar2;
  ICrashStrategy IVar3;
  size_type sVar4;
  string lower;
  
  std::__cxx11::string::string((string *)&lower,(string *)strategy);
  trim(&lower,&default_non_chars_abi_cxx11_);
  for (sVar4 = 0; lower._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    iVar2 = tolower((uint)(byte)lower._M_dataplus._M_p[sVar4]);
    lower._M_dataplus._M_p[sVar4] = (char)iVar2;
  }
  bVar1 = std::operator==(&lower,"penalty");
  IVar3 = kPenalty;
  if (!bVar1) {
    bVar1 = std::operator==(&lower,"admm");
    if (bVar1) {
      IVar3 = kAdmm;
    }
    else {
      bVar1 = std::operator==(&lower,"ica");
      if (bVar1) {
        IVar3 = kICA;
      }
      else {
        bVar1 = std::operator==(&lower,"update_penalty");
        if (bVar1) {
          IVar3 = kUpdatePenalty;
        }
        else {
          bVar1 = std::operator==(&lower,"update_admm");
          if (!bVar1) {
            bVar1 = false;
            goto LAB_0031d710;
          }
          IVar3 = kUpdateAdmm;
        }
      }
    }
  }
  *icrash_strategy = IVar3;
  bVar1 = true;
LAB_0031d710:
  std::__cxx11::string::~string((string *)&lower);
  return bVar1;
}

Assistant:

bool parseICrashStrategy(const std::string& strategy,
                         ICrashStrategy& icrash_strategy) {
  std::string lower = strategy;
  trim(lower);
  std::transform(lower.begin(), lower.end(), lower.begin(),
                 [](unsigned char c) { return std::tolower(c); });

  if (lower == "penalty")
    icrash_strategy = ICrashStrategy::kPenalty;
  else if (lower == "admm")
    icrash_strategy = ICrashStrategy::kAdmm;
  else if (lower == "ica")
    icrash_strategy = ICrashStrategy::kICA;
  else if (lower == "update_penalty")
    icrash_strategy = ICrashStrategy::kUpdatePenalty;
  else if (lower == "update_admm")
    icrash_strategy = ICrashStrategy::kUpdateAdmm;
  else
    return false;
  return true;
}